

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool google::protobuf::util::FieldMaskUtil::FromJsonString(string_view str,FieldMask *out)

{
  bool bVar1;
  string *in_RCX;
  pointer pbVar2;
  string_view input;
  string snakecase_path;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_40;
  
  FieldMask::Clear(out);
  local_60.field_2._M_local_buf[0] = ',';
  local_60._M_dataplus._M_p = (pointer)str._M_len;
  local_60._M_string_length = (size_type)str._M_str;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_40,
             (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)&local_60);
  pbVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar2 == local_40._M_impl.super__Vector_impl_data._M_finish) {
LAB_00cc583b:
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&local_40);
      return pbVar2 == local_40._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((FieldMaskUtil *)pbVar2->_M_len != (FieldMaskUtil *)0x0) {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      input._M_str = (char *)&local_60;
      input._M_len = (size_t)pbVar2->_M_str;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      bVar1 = CamelCaseToSnakeCase((FieldMaskUtil *)pbVar2->_M_len,input,in_RCX);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_60);
        goto LAB_00cc583b;
      }
      internal::AddToRepeatedPtrField<std::__cxx11::string&>
                (&(out->field_0)._impl_.paths_,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

bool FieldMaskUtil::FromJsonString(absl::string_view str, FieldMask* out) {
  out->Clear();
  std::vector<absl::string_view> paths = absl::StrSplit(str, ',');
  for (absl::string_view path : paths) {
    if (path.empty()) continue;
    std::string snakecase_path;
    if (!CamelCaseToSnakeCase(path, &snakecase_path)) {
      return false;
    }
    out->add_paths(snakecase_path);
  }
  return true;
}